

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

int Bmc_CollapseExpandRound2
              (sat_solver *pSat,Vec_Int_t *vLits,Vec_Int_t *vTemp,int nBTLimit,int fOnOffSetLit)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  vTemp->nSize = 0;
  for (iVar5 = 0; iVar5 < vLits->nSize; iVar5 = iVar5 + 1) {
    iVar3 = Vec_IntEntry(vLits,iVar5);
    if (iVar3 != -1) {
      Vec_IntPush(vTemp,iVar3);
    }
  }
  if (vTemp->nSize < 1) {
    __assert_fail("Vec_IntSize(vTemp) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x16c,
                  "int Bmc_CollapseExpandRound2(sat_solver *, Vec_Int_t *, Vec_Int_t *, int, int)");
  }
  if (fOnOffSetLit < 0) {
    iVar5 = sat_solver_minimize_assumptions(pSat,vTemp->pArray,vTemp->nSize,nBTLimit);
    Vec_IntShrink(vTemp,iVar5);
  }
  else {
    sat_solver_push(pSat,fOnOffSetLit);
    iVar5 = sat_solver_minimize_assumptions(pSat,vTemp->pArray,vTemp->nSize,nBTLimit);
    Vec_IntShrink(vTemp,iVar5);
    sat_solver_pop(pSat);
  }
  iVar5 = 0;
  do {
    if (vLits->nSize <= iVar5) {
      return 0;
    }
    iVar3 = Vec_IntEntry(vLits,iVar5);
    if (iVar3 != -1) {
      uVar2 = vTemp->nSize;
      if (vTemp->nSize < 1) {
        uVar2 = 0;
      }
      uVar4 = 0;
      do {
        if (uVar2 == uVar4) {
          Vec_IntWriteEntry(vLits,iVar5,-1);
          break;
        }
        piVar1 = vTemp->pArray + uVar4;
        uVar4 = uVar4 + 1;
      } while (*piVar1 != iVar3);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int Bmc_CollapseExpandRound2( sat_solver * pSat, Vec_Int_t * vLits, Vec_Int_t * vTemp, int nBTLimit, int fOnOffSetLit )
{
    // put into new array
    int i, iLit, nLits;
    Vec_IntClear( vTemp );
    Vec_IntForEachEntry( vLits, iLit, i )
        if ( iLit != -1 )
            Vec_IntPush( vTemp, iLit );
    assert( Vec_IntSize(vTemp) > 0 );
    // assume condition literal
    if ( fOnOffSetLit >= 0 )
        sat_solver_push( pSat, fOnOffSetLit );
    // minimize
    nLits = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vTemp), Vec_IntSize(vTemp), nBTLimit );
    Vec_IntShrink( vTemp, nLits );
    // assume conditional literal
    if ( fOnOffSetLit >= 0 )
        sat_solver_pop( pSat );
    // modify output literas
    Vec_IntForEachEntry( vLits, iLit, i )
        if ( iLit != -1 && Vec_IntFind(vTemp, iLit) == -1 )
            Vec_IntWriteEntry( vLits, i, -1 );
    return 0;
}